

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall BotscriptParser::parseSwitchCase(BotscriptParser *this)

{
  List<ScopeInfo> *this_00;
  _Elt_pointer pCVar1;
  int iVar2;
  bool bVar3;
  ScopeInfo *pSVar4;
  TokenInfo *pTVar5;
  long lVar6;
  DataBuffer *pDVar7;
  _Elt_pointer pCVar8;
  CaseInfo *info;
  _Elt_pointer pCVar9;
  int local_44;
  _Map_pointer local_40;
  List<ScopeInfo> *local_38;
  
  this_00 = &this->m_scopeStack;
  pSVar4 = List<ScopeInfo>::operator[](this_00,this->m_scopeCursor);
  if (pSVar4->type != SCOPE_Switch) {
    error<>("case label outside switch");
  }
  bVar3 = Lexer::next(this->m_lexer,Minus);
  Lexer::mustGetNext(this->m_lexer,Number);
  pTVar5 = Lexer::token(this->m_lexer);
  lVar6 = String::toLong(&pTVar5->text,(bool *)0x0,10);
  local_44 = -(int)lVar6;
  if (!bVar3) {
    local_44 = (int)lVar6;
  }
  Lexer::mustGetNext(this->m_lexer,Colon);
  local_38 = this_00;
  pSVar4 = List<ScopeInfo>::operator[](this_00,this->m_scopeCursor);
  pCVar9 = (pSVar4->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pCVar8 = (pSVar4->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  local_40 = (pSVar4->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pCVar1 = (pSVar4->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while (pCVar9 != pCVar1) {
    if (pCVar9->number == local_44) {
      error<int>("multiple case %1 labels in one switch",&local_44);
    }
    pCVar9 = pCVar9 + 1;
    if (pCVar9 == pCVar8) {
      pCVar9 = local_40[1];
      local_40 = local_40 + 1;
      pCVar8 = pCVar9 + 0x15;
    }
  }
  this->m_switchBuffer = (DataBuffer *)0x0;
  pDVar7 = currentBuffer(this);
  DataBuffer::writeHeader(pDVar7,CaseGoto);
  pDVar7 = currentBuffer(this);
  DataBuffer::writeDWord(pDVar7,local_44);
  addSwitchCase(this,(DataBuffer *)0x0);
  iVar2 = local_44;
  pSVar4 = List<ScopeInfo>::operator[](local_38,this->m_scopeCursor);
  pSVar4->casecursor->number = iVar2;
  return;
}

Assistant:

void BotscriptParser::parseSwitchCase()
{
	// case is only allowed inside switch
	if (SCOPE (0).type != SCOPE_Switch)
		error ("case label outside switch");

	// Get a literal value for the case block. Zandronum does not support
	// expressions here.
	bool isNegative = m_lexer->next(Token::Minus);
	m_lexer->mustGetNext (Token::Number);
	int num = m_lexer->token()->text.toLong();
	if (isNegative) {
		num = -num;
	}
	m_lexer->mustGetNext (Token::Colon);

	for (const CaseInfo& info : SCOPE(0).cases)
	{
		if (info.number == num)
			error ("multiple case %1 labels in one switch", num);
	}

	// Write down the expression and case-go-to. This builds
	// the case tree. The closing event will write the actual
	// blocks and move the marks appropriately.
	//
	// AddSwitchCase will add the reference to the mark
	// for the case block that this heralds, and takes care
	// of buffering setup and stuff like that.
	//
	// We null the switch buffer for the case-go-to statement as
	// we want it all under the switch, not into the case-buffers.
	m_switchBuffer = nullptr;
	currentBuffer()->writeHeader (DataHeader::CaseGoto);
	currentBuffer()->writeDWord (num);
	addSwitchCase (null);
	SCOPE (0).casecursor->number = num;
}